

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall PowerPos<0,_0,_0>::propagate_y(PowerPos<0,_0,_0> *this)

{
  IntVar *pIVar1;
  IntVar *pIVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int64_t m_v;
  double dVar11;
  double dVar12;
  
  iVar3 = (((this->z).var)->min).v;
  if ((0 < iVar3) && (1 < (((this->x).var)->max).v)) {
    dVar11 = log2((double)iVar3);
    dVar12 = log2((double)(((this->x).var)->max).v);
    dVar11 = ceil(dVar11 / dVar12);
    lVar5 = (long)dVar11;
    lVar6 = (long)(((this->y).var)->min).v;
    if (lVar6 < lVar5) {
      pIVar1 = (this->z).var;
      if (lVar5 + -1 == 0) {
        lVar9 = 1;
      }
      else {
        iVar3 = (((this->x).var)->max).v;
        lVar8 = (long)iVar3;
        if (iVar3 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = lVar8;
          if (2 < lVar5) {
            lVar10 = lVar5 + -2;
            do {
              lVar9 = lVar9 * lVar8;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
        }
      }
      lVar8 = lVar5 + -1;
      if (lVar9 < (pIVar1->min).v) {
        lVar8 = lVar5;
      }
      if (lVar6 < lVar8) {
        if (so.lazy == true) {
          iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[8])();
          uVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          uVar7 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
        }
        else {
          uVar7 = 0;
        }
        pIVar1 = (this->y).var;
        iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xe])(pIVar1,lVar8,uVar7,1);
        if ((char)iVar3 == '\0') {
          return false;
        }
      }
    }
  }
  if ((((this->x).var)->min).v < 2) {
    return true;
  }
  dVar11 = log2((double)(((this->z).var)->max).v);
  dVar12 = log2((double)(((this->x).var)->min).v);
  dVar11 = floor(dVar11 / dVar12);
  lVar5 = (long)dVar11;
  if (lVar5 < (((this->y).var)->max).v) {
    pIVar1 = (this->x).var;
    pIVar2 = (this->z).var;
    lVar6 = 1;
    if (lVar5 + 1 != 0) {
      iVar3 = (pIVar1->min).v;
      lVar9 = (long)iVar3;
      if (iVar3 == 0) {
        lVar6 = 0;
      }
      else {
        lVar6 = lVar9;
        lVar8 = lVar5;
        if (0 < lVar5) {
          do {
            lVar6 = lVar6 * lVar9;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
      }
    }
    lVar9 = lVar5 + 1;
    if (lVar6 < (pIVar2->max).v) {
      lVar9 = lVar5;
    }
    if (lVar9 < (pIVar1->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[9])();
        uVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar7 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
      }
      else {
        uVar7 = 0;
      }
      pIVar1 = (this->x).var;
      iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xf])(pIVar1,lVar9,uVar7,1);
      if ((char)iVar3 == '\0') {
        return false;
      }
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate_y() {
		double log_res;
		// Propagation on the lower bound
		if (z.getMin() > 0 && x.getMax() > 1) {
			log_res = log2(z.getMin()) / log2(x.getMax());
			int64_t y_min_new = static_cast<int64_t>(ceil(log_res));
			if (y_min_new > y.getMin()) {
				// Check for numerical errors and correct them
				if (z.getMin() <= my_pow(x.getMax(), y_min_new - 1)) {
					y_min_new--;
				}
				setDom(y, setMin, y_min_new, z.getMinLit(), x.getMaxLit());
			}
		}
		// Propagation on the upper bound
		if (x.getMin() > 1) {
			log_res = log2(z.getMax()) / log2(x.getMin());
			int64_t y_max_new = static_cast<int64_t>(floor(log_res));
			if (y_max_new < y.getMax()) {
				// Check for numerical errors and correct them
				if (z.getMax() <= my_pow(x.getMin(), y_max_new + 1)) {
					y_max_new++;
				}
				setDom(x, setMax, y_max_new, z.getMaxLit(), x.getMinLit());
			}
		}
		return true;
	}